

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O1

void rune_autoinscribe(player *p,wchar_t i)

{
  loc grid;
  _Bool _Var1;
  object *poVar2;
  
  _Var1 = player_knows_rune(p,(long)i);
  if (_Var1) {
    if (cave != (chunk_conflict *)0x0) {
      grid.x = (p->grid).x;
      grid.y = (p->grid).y;
      for (poVar2 = square_object(cave,grid); poVar2 != (object *)0x0; poVar2 = poVar2->next) {
        _Var1 = object_has_rune(poVar2,i);
        if (_Var1) {
          rune_add_autoinscription(poVar2,i);
        }
      }
    }
    for (poVar2 = p->gear; poVar2 != (object *)0x0; poVar2 = poVar2->next) {
      _Var1 = object_has_rune(poVar2,i);
      if (_Var1) {
        rune_add_autoinscription(poVar2,i);
      }
    }
  }
  return;
}

Assistant:

void rune_autoinscribe(struct player *p, int i)
{
	struct object *obj;

	/* Check the player knows the rune */
	if (!player_knows_rune(p, i)) {
		return;
	}

	/* Autoinscribe each object on the ground */
	if (cave)
		for (obj = square_object(cave, p->grid); obj; obj = obj->next)
			if (object_has_rune(obj, i))
				rune_add_autoinscription(obj, i);

	/* Autoinscribe each object in the inventory */
	for (obj = p->gear; obj; obj = obj->next)
		if (object_has_rune(obj, i))
			rune_add_autoinscription(obj, i);
}